

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O0

void __thiscall
pfederc::Capabilities::Capabilities
          (Capabilities *this,bool isunused,bool isinline,bool isconstant,
          vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
          *required,
          vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
          *ensures)

{
  vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  *ensures_local;
  vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  *required_local;
  bool isconstant_local;
  bool isinline_local;
  bool isunused_local;
  Capabilities *this_local;
  
  this->isunused = isunused;
  this->isinline = isinline;
  this->isconstant = isconstant;
  std::
  vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ::vector(&this->required,required);
  std::
  vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ::vector(&this->ensures,ensures);
  return;
}

Assistant:

Capabilities::Capabilities(bool isunused, bool isinline, bool isconstant,
    std::vector<std::unique_ptr<Expr>> &&required,
    std::vector<std::unique_ptr<Expr>> &&ensures) noexcept
    : isunused{isunused}, isinline{isinline}, isconstant{isconstant},
      required(std::move(required)), ensures(std::move(ensures)) {}